

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_global_escape(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  JSValue JVar4;
  int c;
  int len;
  int i;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue str;
  JSValue in_stack_ffffffffffffff68;
  JSValue JVar5;
  JSContext *ctx_00;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined1 local_10 [16];
  
  local_10 = (undefined1  [16])JS_ToString((JSContext *)0x1b63f2,in_stack_ffffffffffffff68);
  JVar5 = (JSValue)local_10;
  iVar1 = JS_IsException((JSValue)local_10);
  if (iVar1 == 0) {
    string_buffer_init((JSContext *)JVar5.tag,(StringBuffer *)JVar5.u.ptr,0);
    uVar2 = (uint)*(undefined8 *)((long)local_10._0_8_.ptr + 4) & 0x7fffffff;
    for (iVar1 = 0; ctx_00 = (JSContext *)JVar5.tag, iVar1 < (int)uVar2; iVar1 = iVar1 + 1) {
      in_stack_ffffffffffffff7c = string_get((JSString *)local_10._0_8_.ptr,iVar1);
      iVar3 = isUnescaped(0);
      if (iVar3 == 0) {
        encodeURI_hex((StringBuffer *)CONCAT44(iVar1,uVar2),in_stack_ffffffffffffff7c);
      }
      else {
        string_buffer_putc16((StringBuffer *)JVar5.u.ptr,0);
      }
    }
    JVar5.u._4_4_ = in_stack_ffffffffffffff7c;
    JVar5.u.int32 = in_stack_ffffffffffffff78;
    JVar5.tag._0_4_ = uVar2;
    JVar5.tag._4_4_ = iVar1;
    JS_FreeValue(ctx_00,JVar5);
    local_10 = (undefined1  [16])string_buffer_end((StringBuffer *)ctx_00);
  }
  JVar4.u = (JSValueUnion)local_10._0_8_;
  JVar4.tag = local_10._8_8_;
  return JVar4;
}

Assistant:

static JSValue js_global_escape(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int i, len, c;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (i = 0, len = p->len; i < len; i++) {
        c = string_get(p, i);
        if (isUnescaped(c)) {
            string_buffer_putc16(b, c);
        } else {
            encodeURI_hex(b, c);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);
}